

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ShaderMatrixCase::setupUniforms
          (ShaderMatrixCase *this,int programID,Vec4 *constCoords)

{
  code *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  int local_9c;
  allocator<char> local_95;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar3;
  
  local_94 = programID;
  iVar2 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  for (local_9c = 0; local_9c < 2; local_9c = local_9c + 1) {
    lVar4 = 0x128;
    if (local_9c == 1) {
      lVar4 = 0x134;
    }
    if (*(int *)((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode
                + lVar4) == 1) {
      pcVar1 = *(code **)(lVar3 + 0xb48);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u_in",&local_95);
      de::toString<int>(&local_70,&local_9c);
      std::operator+(&local_90,&local_50,&local_70);
      iVar2 = (*pcVar1)(local_94,local_90._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      if (-1 < iVar2) {
        switch(*(undefined4 *)
                ((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode
                + lVar4 + 4)) {
        case 1:
          (**(code **)(lVar3 + 0x14e0))
                    (*(undefined4 *)((long)&s_constInFloat + (long)local_9c * 4),iVar2);
          break;
        case 2:
          (**(code **)(lVar3 + 0x1528))(iVar2,1,s_constInVec2 + (long)local_9c * 8);
          break;
        case 3:
          (**(code **)(lVar3 + 0x1568))(iVar2,1,s_constInVec3 + (long)local_9c * 0xc);
          break;
        case 4:
          (**(code **)(lVar3 + 0x15a8))(iVar2,1,s_constInVec4 + (long)local_9c * 0x10);
          break;
        case 5:
          (**(code **)(lVar3 + 0x15e0))(iVar2,1,1,s_constInMat2x2 + (long)local_9c * 0x10);
          break;
        case 6:
          (**(code **)(lVar3 + 0x15f0))(iVar2,1,1,s_constInMat2x3 + (long)local_9c * 0x18);
          break;
        case 7:
          (**(code **)(lVar3 + 0x1600))(iVar2,1,1,s_constInMat2x4 + (long)local_9c * 0x20);
          break;
        case 8:
          (**(code **)(lVar3 + 0x1620))(iVar2,1,1,s_constInMat3x2 + (long)local_9c * 0x18);
          break;
        case 9:
          (**(code **)(lVar3 + 0x1610))(iVar2,1,1,s_constInMat3x3 + (long)local_9c * 0x24);
          break;
        case 10:
          (**(code **)(lVar3 + 0x1630))(iVar2,1,1,s_constInMat3x4 + (long)local_9c * 0x30);
          break;
        case 0xb:
          (**(code **)(lVar3 + 0x1650))(iVar2,1,1,s_constInMat4x2 + (long)local_9c * 0x20);
          break;
        case 0xc:
          (**(code **)(lVar3 + 0x1660))(iVar2,1,1,s_constInMat4x3 + (long)local_9c * 0x30);
          break;
        case 0xd:
          (**(code **)(lVar3 + 0x1640))(iVar2,1,1,s_constInMat4x4 + (long)local_9c * 0x40);
        }
      }
    }
  }
  return;
}

Assistant:

void ShaderMatrixCase::setupUniforms (int programID, const tcu::Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	for (int inNdx = 0; inNdx < 2; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			int loc = gl.getUniformLocation(programID, (string("u_in") + de::toString(inNdx)).c_str());

			if (loc < 0)
				continue;

			switch (in.dataType)
			{
				case TYPE_FLOAT:		gl.uniform1f(loc, s_constInFloat[inNdx]);						break;
				case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, s_constInVec2[inNdx].getPtr());			break;
				case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, s_constInVec3[inNdx].getPtr());			break;
				case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, s_constInVec4[inNdx].getPtr());			break;
				// \note GLES3 supports transpose in matrix upload.
				case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv	(loc, 1, GL_TRUE, s_constInMat2x2[inNdx]);	break;
				case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(loc, 1, GL_TRUE, s_constInMat2x3[inNdx]);	break;
				case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(loc, 1, GL_TRUE, s_constInMat2x4[inNdx]);	break;
				case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(loc, 1, GL_TRUE, s_constInMat3x2[inNdx]);	break;
				case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv	(loc, 1, GL_TRUE, s_constInMat3x3[inNdx]);	break;
				case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(loc, 1, GL_TRUE, s_constInMat3x4[inNdx]);	break;
				case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(loc, 1, GL_TRUE, s_constInMat4x2[inNdx]);	break;
				case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(loc, 1, GL_TRUE, s_constInMat4x3[inNdx]);	break;
				case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv	(loc, 1, GL_TRUE, s_constInMat4x4[inNdx]);	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
}